

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EdgeControlSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeControlSpecifierSyntax,slang::syntax::EdgeControlSpecifierSyntax_const&>
          (BumpAllocator *this,EdgeControlSpecifierSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  EdgeControlSpecifierSyntax *pEVar8;
  
  pEVar8 = (EdgeControlSpecifierSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EdgeControlSpecifierSyntax *)this->endPtr < pEVar8 + 1) {
    pEVar8 = (EdgeControlSpecifierSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pEVar8 + 1);
  }
  (pEVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pEVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pEVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pEVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->openBracket).field_0x2;
  NVar6.raw = (args->openBracket).numFlags.raw;
  uVar7 = (args->openBracket).rawLen;
  pIVar2 = (args->openBracket).info;
  (pEVar8->openBracket).kind = (args->openBracket).kind;
  (pEVar8->openBracket).field_0x2 = uVar5;
  (pEVar8->openBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar8->openBracket).rawLen = uVar7;
  (pEVar8->openBracket).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->descriptors).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->descriptors).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar8->descriptors).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->descriptors).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar8->descriptors).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pEVar8->descriptors).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar8->descriptors).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->descriptors).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar8->descriptors).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pEVar8->descriptors).super_SyntaxListBase.childCount =
       (args->descriptors).super_SyntaxListBase.childCount;
  (pEVar8->descriptors).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d5cf8;
  sVar3 = (args->descriptors).elements._M_extent._M_extent_value;
  (pEVar8->descriptors).elements._M_ptr = (args->descriptors).elements._M_ptr;
  (pEVar8->descriptors).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeBracket).field_0x2;
  NVar6.raw = (args->closeBracket).numFlags.raw;
  uVar7 = (args->closeBracket).rawLen;
  pIVar2 = (args->closeBracket).info;
  (pEVar8->closeBracket).kind = (args->closeBracket).kind;
  (pEVar8->closeBracket).field_0x2 = uVar5;
  (pEVar8->closeBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar8->closeBracket).rawLen = uVar7;
  (pEVar8->closeBracket).info = pIVar2;
  return pEVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }